

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompatabilityTests.cpp
# Opt level: O0

void __thiscall
TEST_StandardCppLibrary_UniquePtrConversationToBool_Test::testBody
          (TEST_StandardCppLibrary_UniquePtrConversationToBool_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  unique_ptr<int,_std::default_delete<int>_> local_30;
  __single_object notNull;
  unique_ptr<int,_std::default_delete<int>_> local_18;
  unique_ptr<int,_std::default_delete<int>_> aNull;
  TEST_StandardCppLibrary_UniquePtrConversationToBool_Test *this_local;
  
  aNull._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)
                 (__uniq_ptr_data<int,_std::default_delete<int>,_true,_true>)this;
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            ((unique_ptr<int,std::default_delete<int>> *)&local_18,(nullptr_t)0x0);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK_FALSE","aNull",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CompatabilityTests.cpp"
             ,0x11,pTVar3);
  std::make_unique<int,int>((int *)&local_30);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK_TRUE","notNull",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CompatabilityTests.cpp"
             ,0x14,pTVar3);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_30);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST(StandardCppLibrary, UniquePtrConversationToBool)
{
    auto const aNull = std::unique_ptr<int>(NULLPTR);
    CHECK_FALSE(aNull);

    auto const notNull = std::make_unique<int>(1);
    CHECK_TRUE(notNull);
}